

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O2

Gia_Man_t * Gia_ManDupCofactorVar(Gia_Man_t *p,int iVar,int Value)

{
  uint uVar1;
  int iLit0;
  Gia_Man_t *p_00;
  char *pcVar2;
  Gia_Obj_t *pGVar3;
  Gia_Man_t *pGVar4;
  int iVar5;
  
  if ((iVar < 0) || (p->vCis->nSize - p->nRegs <= iVar)) {
    __assert_fail("iVar >= 0 && iVar < Gia_ManPiNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                  ,0x64b,"Gia_Man_t *Gia_ManDupCofactorVar(Gia_Man_t *, int, int)");
  }
  if (1 < (uint)Value) {
    __assert_fail("Value == 0 || Value == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                  ,0x64c,"Gia_Man_t *Gia_ManDupCofactorVar(Gia_Man_t *, int, int)");
  }
  p_00 = Gia_ManStart(p->nObjs);
  pcVar2 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar2;
  pcVar2 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar2;
  Gia_ManFillValue(p);
  p->pObjs->Value = 0;
  for (iVar5 = 0; iVar5 < p->vCis->nSize; iVar5 = iVar5 + 1) {
    pGVar3 = Gia_ManCi(p,iVar5);
    if (pGVar3 == (Gia_Obj_t *)0x0) break;
    uVar1 = Gia_ManAppendCi(p_00);
    pGVar3->Value = uVar1;
  }
  pGVar3 = Gia_ManPi(p,iVar);
  pGVar3->Value = Value;
  Gia_ManHashAlloc(p_00);
  for (iVar5 = 0; iVar5 < p->vCos->nSize; iVar5 = iVar5 + 1) {
    pGVar3 = Gia_ManCo(p,iVar5);
    if (pGVar3 == (Gia_Obj_t *)0x0) break;
    Gia_ManDupCofactorVar_rec(p_00,p,pGVar3 + -(ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff));
  }
  for (iVar5 = 0; iVar5 < p->vCos->nSize; iVar5 = iVar5 + 1) {
    pGVar3 = Gia_ManCo(p,iVar5);
    if (pGVar3 == (Gia_Obj_t *)0x0) break;
    iLit0 = Gia_ObjFanin0Copy(pGVar3);
    Gia_ManAppendCo(p_00,iLit0);
  }
  Gia_ManSetRegNum(p_00,p->nRegs);
  p_00->nConstrs = p->nConstrs;
  pGVar4 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar4;
}

Assistant:

Gia_Man_t * Gia_ManDupCofactorVar( Gia_Man_t * p, int iVar, int Value )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i;
    assert( iVar >= 0 && iVar < Gia_ManPiNum(p) );
    assert( Value == 0 || Value == 1 );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    Gia_ManPi( p, iVar )->Value = Value; // modification!
    Gia_ManHashAlloc( pNew );
    Gia_ManForEachCo( p, pObj, i )
        Gia_ManDupCofactorVar_rec( pNew, p, Gia_ObjFanin0(pObj) );
    Gia_ManForEachCo( p, pObj, i )
        Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    pNew->nConstrs = p->nConstrs;
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}